

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf2c.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char *__s;
  char cVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  long *plVar6;
  runtime_error *this;
  int *piVar7;
  long *plVar8;
  int iVar9;
  byte *pbVar10;
  string bfFilename;
  vector<char,_std::allocator<char>_> bfContent;
  string code;
  ofstream cFile;
  ifstream bfFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  vector<char,_std::allocator<char>_> local_490;
  long *local_478;
  long local_470;
  long local_468 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  long *local_438;
  long local_430;
  long local_428;
  long lStack_420;
  ios_base local_340 [264];
  string local_238 [16];
  
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0._M_string_length = 0;
  local_4b0.field_2._M_local_buf[0] = '\0';
  if (argc == 2) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_4b0,0,(char *)0x0,(ulong)__s);
    local_478 = local_468;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_478,
               "#include <stdio.h>\n#include <stdlib.h>\n\nint main() {\n\tchar* p = calloc(30000, sizeof(char));\n"
               ,"");
    std::ifstream::ifstream(local_238,(string *)&local_4b0,_S_bin|_S_ate);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Failed to open \'",0x10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_4b0._M_dataplus._M_p,
                          local_4b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'.",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      iVar9 = 1;
      std::ostream::flush();
    }
    else {
      lVar3 = std::istream::tellg();
      std::istream::seekg((long)local_238,_S_beg);
      lVar4 = std::istream::tellg();
      if (lVar3 == lVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The file \'",10);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_4b0._M_dataplus._M_p,
                            local_4b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' was empty.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        iVar9 = 1;
        std::ostream::flush();
      }
      else {
        std::vector<char,_std::allocator<char>_>::vector
                  (&local_490,lVar3 - lVar4,(allocator_type *)&local_438);
        plVar6 = (long *)std::istream::read((char *)local_238,
                                            (long)local_490.
                                                  super__Vector_base<char,_std::allocator<char>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
        if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_458,&local_4b0,": ");
          piVar7 = __errno_location();
          strerror(*piVar7);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_458);
          local_438 = (long *)*plVar6;
          plVar8 = plVar6 + 2;
          if (local_438 == plVar8) {
            local_428 = *plVar8;
            lStack_420 = plVar6[3];
            local_438 = &local_428;
          }
          else {
            local_428 = *plVar8;
          }
          local_430 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::runtime_error::runtime_error(this,(string *)&local_438);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::ifstream::close();
        if (local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          cVar2 = '\x01';
          pbVar10 = (byte *)local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start;
          do {
            bVar1 = *pbVar10;
            local_438 = &local_428;
            std::__cxx11::string::_M_construct((ulong)&local_438,cVar2 - (bVar1 == 0x5d));
            std::__cxx11::string::_M_append((char *)&local_478,(ulong)local_438);
            if (local_438 != &local_428) {
              operator_delete(local_438,local_428 + 1);
            }
            if (bVar1 < 0x3c) {
              switch(bVar1) {
              case 0x2b:
                break;
              case 0x2c:
                break;
              case 0x2d:
                break;
              case 0x2e:
                break;
              default:
                goto switchD_001027e6_default;
              }
LAB_0010285b:
              std::__cxx11::string::append((char *)&local_478);
            }
            else if (bVar1 < 0x5b) {
              if ((bVar1 == 0x3c) || (bVar1 == 0x3e)) goto LAB_0010285b;
            }
            else if (bVar1 == 0x5b) {
              std::__cxx11::string::append((char *)&local_478);
              cVar2 = cVar2 + '\x01';
            }
            else if (bVar1 == 0x5d) {
              std::__cxx11::string::append((char *)&local_478);
              cVar2 = cVar2 + -1;
            }
switchD_001027e6_default:
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 !=
                   (byte *)local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        }
        std::__cxx11::string::append((char *)&local_478);
        std::ofstream::ofstream(&local_438,"output.c",_S_out);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_438,(char *)local_478,local_470);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        local_438 = _VTT;
        *(undefined8 *)((long)&local_438 + _VTT[-3]) = ___cxa_atexit;
        std::filebuf::~filebuf((filebuf *)&local_430);
        std::ios_base::~ios_base(local_340);
        if ((byte *)local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start != (byte *)0x0) {
          operator_delete(local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_490.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar9 = 0;
      }
    }
    std::ifstream::~ifstream(local_238);
    if (local_478 != local_468) {
      operator_delete(local_478,local_468[0] + 1);
    }
  }
  else {
    if (argc == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Not enough arguments.",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,*argv,(allocator<char> *)&local_438);
      PrintUsage(local_238);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Too much arguments.",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,*argv,(allocator<char> *)&local_438);
      PrintUsage(local_238);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
    }
    iVar9 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT71(local_4b0.field_2._M_allocated_capacity._1_7_,
                             local_4b0.field_2._M_local_buf[0]) + 1);
  }
  return iVar9;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string bfFilename;
    
    if (argc == 1) {
        std::cout << "Not enough arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }
    if (argc == 2) {
        bfFilename = argv[1];
    } else {
        std::cout << "Too much arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }

    std::string code = 
        "#include <stdio.h>" "\n" 
        "#include <stdlib.h>" "\n"
        "\n"
        "int main() {" "\n"
        "\t" "char* p = calloc(30000, sizeof(char));" "\n";
    
    std::ifstream bfFile { bfFilename, std::ios::binary|std::ios::ate };
    
    if (!bfFile.is_open()) {
        std::cout << "Failed to open '" << bfFilename << "'." << std::endl;
        return EXIT_FAILURE;
    }

    auto end = bfFile.tellg();
    bfFile.seekg(0, std::ios::beg);
    auto size = std::size_t(end - bfFile.tellg());

    if (size == 0) {
        std::cout << "The file '" << bfFilename << "' was empty." << std::endl;
        return EXIT_FAILURE;
    }

    std::vector<char> bfContent(size);
    if (!bfFile.read(bfContent.data(), bfContent.size())) {
        throw std::runtime_error(bfFilename + ": " + std::strerror(errno));
    }
    bfFile.close();

    std::size_t tabs = 1;
    for (const char c : bfContent) {
        const std::size_t indent = (c != ']') ? tabs : tabs - 1;
        code += std::string(indent, '\t');
        switch (c) {
            case '>': 
                code += "++p;" "\n";
                break;
            case '<':
                code += "--p;" "\n";
                break;
            case '+':
                code += "++*p;" "\n";
                break;
            case '-':
                code += "--*p;" "\n";
                break;
            case '.':
                code += "putchar(*p);" "\n";
                break;
            case ',':
                code += "*p = getchar();" "\n";
                break;
            case '[':
                code += "while (*p) {" "\n";
                ++tabs;
                break;
            case ']':
                code += "}" "\n";
                --tabs;
                break;
            default: break;
        }
    }

    code += "\t" "free(p);" "\n" "}";

    std::ofstream cFile { "output.c" };
    cFile << code << std::endl;

    return EXIT_SUCCESS;
}